

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTUtilities.h
# Opt level: O0

bool soul::ASTUtilities::exposeChildEndpoints(Allocator *allocator,Graph *graph)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  reference this;
  Graph *graph_00;
  undefined4 extraout_var;
  EndpointDetails *pEVar4;
  SharedEndpoint *pSVar5;
  Connection *o;
  ProcessorInstance *pPVar6;
  Expression *pEVar7;
  ProcessorBase *pPVar8;
  undefined4 extraout_var_00;
  pool_ref<soul::AST::EndpointDeclaration> *ppVar9;
  EndpointDeclaration *pEVar10;
  pool_ref<soul::AST::EndpointDeclaration> *childEndpoint_1;
  pool_ref<soul::AST::EndpointDeclaration> *__end5;
  pool_ref<soul::AST::EndpointDeclaration> *__begin5;
  ArrayView<soul::pool_ref<soul::AST::EndpointDeclaration>_> *local_1f8;
  ArrayView<soul::pool_ref<soul::AST::EndpointDeclaration>_> *__range5;
  pool_ptr<soul::AST::ProcessorBase> childProcessor_2;
  pool_ref<soul::AST::ProcessorInstance> *i_1;
  iterator __end3;
  iterator __begin3;
  vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
  *__range3;
  InterpolationType local_1bc;
  Context local_1b8;
  pool_ref<soul::AST::Connection> local_198;
  pool_ptr<soul::AST::ProcessorInstance> local_190;
  Context local_188;
  SharedEndpoint *local_170;
  SharedEndpoint *child;
  UTF8Reader UStack_160;
  Scope *local_158;
  SharedEndpoint *local_150;
  SharedEndpoint *parent;
  pool_ptr<soul::AST::EndpointDetails> local_140;
  string *local_138;
  bool local_129;
  Context local_128;
  pool_ptr<soul::AST::EndpointDeclaration> local_108;
  Type *local_100;
  Type *t;
  iterator __end7;
  iterator __begin7;
  vector<soul::Type,_std::allocator<soul::Type>_> *__range7;
  pool_ptr<soul::AST::EndpointDeclaration> parentEndpoint;
  pool_ref<soul::AST::EndpointDeclaration> *childEndpoint;
  pool_ref<soul::AST::EndpointDeclaration> *__end4;
  pool_ref<soul::AST::EndpointDeclaration> *__begin4;
  Ptr local_98;
  ArrayView<soul::pool_ref<soul::AST::EndpointDeclaration>_> *__range4;
  pool_ptr<soul::AST::ProcessorBase> childProcessor_1;
  pool_ref<soul::AST::ProcessorInstance> *processorInstance;
  iterator __end2_1;
  iterator __begin2_1;
  vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
  *__range2_1;
  pool_ptr<soul::AST::ProcessorBase> local_58;
  pool_ptr<soul::AST::Graph> local_50;
  pool_ptr<soul::AST::Graph> childGraph;
  pool_ptr<soul::AST::ProcessorBase> childProcessor;
  pool_ref<soul::AST::ProcessorInstance> *i;
  iterator __end2;
  iterator __begin2;
  vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
  *__range2;
  bool anyChanges;
  Graph *graph_local;
  Allocator *allocator_local;
  
  bVar2 = false;
  __end2 = std::
           vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
           ::begin(&graph->processorInstances);
  i = (pool_ref<soul::AST::ProcessorInstance> *)
      std::
      vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
      ::end(&graph->processorInstances);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<soul::pool_ref<soul::AST::ProcessorInstance>_*,_std::vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>_>
                                     *)&i), bVar1) {
    this = __gnu_cxx::
           __normal_iterator<soul::pool_ref<soul::AST::ProcessorInstance>_*,_std::vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>_>
           ::operator*(&__end2);
    pPVar6 = pool_ref<soul::AST::ProcessorInstance>::operator->(this);
    pEVar7 = pool_ptr<soul::AST::Expression>::operator->(&pPVar6->targetProcessor);
    (*(pEVar7->super_Statement).super_ASTObject._vptr_ASTObject[6])(&childGraph);
    bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&childGraph);
    if (bVar1) {
      local_58.object = &(childGraph.object)->super_ProcessorBase;
      cast<soul::AST::Graph,soul::AST::ProcessorBase>((soul *)&local_50,&local_58);
      pool_ptr<soul::AST::ProcessorBase>::~pool_ptr(&local_58);
      bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_50);
      if (bVar1) {
        graph_00 = pool_ptr<soul::AST::Graph>::operator*(&local_50);
        bVar1 = exposeChildEndpoints(allocator,graph_00);
        if (bVar1) {
          bVar2 = true;
        }
      }
      pool_ptr<soul::AST::Graph>::~pool_ptr(&local_50);
    }
    pool_ptr<soul::AST::ProcessorBase>::~pool_ptr((pool_ptr<soul::AST::ProcessorBase> *)&childGraph)
    ;
    __gnu_cxx::
    __normal_iterator<soul::pool_ref<soul::AST::ProcessorInstance>_*,_std::vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>_>
    ::operator++(&__end2);
  }
  __end2_1 = std::
             vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
             ::begin(&graph->processorInstances);
  processorInstance =
       (pool_ref<soul::AST::ProcessorInstance> *)
       std::
       vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
       ::end(&graph->processorInstances);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<soul::pool_ref<soul::AST::ProcessorInstance>_*,_std::vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>_>
                             *)&processorInstance), bVar1) {
    childProcessor_1.object =
         (ProcessorBase *)
         __gnu_cxx::
         __normal_iterator<soul::pool_ref<soul::AST::ProcessorInstance>_*,_std::vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>_>
         ::operator*(&__end2_1);
    pPVar6 = pool_ref<soul::AST::ProcessorInstance>::operator->
                       ((pool_ref<soul::AST::ProcessorInstance> *)childProcessor_1.object);
    pEVar7 = pool_ptr<soul::AST::Expression>::operator->(&pPVar6->targetProcessor);
    (*(pEVar7->super_Statement).super_ASTObject._vptr_ASTObject[6])(&__range4);
    bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&__range4);
    if (bVar1) {
      pPVar8 = pool_ptr<soul::AST::ProcessorBase>::operator->
                         ((pool_ptr<soul::AST::ProcessorBase> *)&__range4);
      iVar3 = (*(pPVar8->super_ModuleBase).super_ASTObject._vptr_ASTObject[8])();
      __begin4 = (pool_ref<soul::AST::EndpointDeclaration> *)CONCAT44(extraout_var,iVar3);
      local_98.object = (SourceCodeText *)&__begin4;
      __end4 = ArrayView<soul::pool_ref<soul::AST::EndpointDeclaration>_>::begin
                         ((ArrayView<soul::pool_ref<soul::AST::EndpointDeclaration>_> *)
                          local_98.object);
      ppVar9 = ArrayView<soul::pool_ref<soul::AST::EndpointDeclaration>_>::end
                         ((ArrayView<soul::pool_ref<soul::AST::EndpointDeclaration>_> *)
                          local_98.object);
      for (; __end4 != ppVar9; __end4 = __end4 + 1) {
        parentEndpoint.object = (EndpointDeclaration *)__end4;
        pEVar10 = pool_ref<soul::AST::EndpointDeclaration>::operator->(__end4);
        if ((pEVar10->needsToBeExposedInParent & 1U) != 0) {
          pEVar10 = pool_ref<soul::AST::EndpointDeclaration>::operator->(parentEndpoint.object);
          AST::ProcessorBase::findEndpoint<soul::Identifier>
                    ((ProcessorBase *)&__range7,(Identifier *)graph,(bool)((char)pEVar10 + '0'));
          bVar2 = pool_ptr<soul::AST::EndpointDeclaration>::operator!=
                            ((pool_ptr<soul::AST::EndpointDeclaration> *)&__range7,(void *)0x0);
          if (bVar2) {
            pEVar10 = pool_ref<soul::AST::EndpointDeclaration>::operator->(parentEndpoint.object);
            pEVar4 = AST::EndpointDeclaration::getDetails(pEVar10);
            AST::EndpointDetails::getResolvedDataTypes
                      ((vector<soul::Type,_std::allocator<soul::Type>_> *)&__begin7,pEVar4);
            __end7 = std::vector<soul::Type,_std::allocator<soul::Type>_>::begin
                               ((vector<soul::Type,_std::allocator<soul::Type>_> *)&__begin7);
            t = (Type *)std::vector<soul::Type,_std::allocator<soul::Type>_>::end
                                  ((vector<soul::Type,_std::allocator<soul::Type>_> *)&__begin7);
            while (bVar2 = __gnu_cxx::operator!=
                                     (&__end7,(__normal_iterator<soul::Type_*,_std::vector<soul::Type,_std::allocator<soul::Type>_>_>
                                               *)&t), bVar2) {
              local_100 = __gnu_cxx::
                          __normal_iterator<soul::Type_*,_std::vector<soul::Type,_std::allocator<soul::Type>_>_>
                          ::operator*(&__end7);
              pEVar10 = pool_ptr<soul::AST::EndpointDeclaration>::operator*
                                  ((pool_ptr<soul::AST::EndpointDeclaration> *)&__range7);
              ensureEventEndpointSupportsType(allocator,pEVar10,local_100);
              __gnu_cxx::
              __normal_iterator<soul::Type_*,_std::vector<soul::Type,_std::allocator<soul::Type>_>_>
              ::operator++(&__end7);
            }
            std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector
                      ((vector<soul::Type,_std::allocator<soul::Type>_> *)&__begin7);
          }
          else {
            local_128.location.sourceCode.object = (SourceCodeText *)0x0;
            local_128.location.location.data = (char *)0x0;
            local_128.parentScope = (Scope *)0x0;
            AST::Context::Context(&local_128);
            local_129 = false;
            pEVar10 = AST::Allocator::
                      allocate<soul::AST::EndpointDeclaration,soul::AST::Context,bool>
                                (allocator,&local_128,&local_129);
            pool_ptr<soul::AST::EndpointDeclaration>::pool_ptr<soul::AST::EndpointDeclaration,void>
                      (&local_108,pEVar10);
            __range7 = (vector<soul::Type,_std::allocator<soul::Type>_> *)local_108.object;
            pool_ptr<soul::AST::EndpointDeclaration>::~pool_ptr(&local_108);
            AST::Context::~Context(&local_128);
            pEVar10 = pool_ref<soul::AST::EndpointDeclaration>::operator->(parentEndpoint.object);
            local_138 = (string *)AST::Allocator::get<soul::Identifier>(allocator,&pEVar10->name);
            pEVar10 = pool_ptr<soul::AST::EndpointDeclaration>::operator->
                                ((pool_ptr<soul::AST::EndpointDeclaration> *)&__range7);
            (pEVar10->name).name = local_138;
            pEVar10 = pool_ref<soul::AST::EndpointDeclaration>::operator->(parentEndpoint.object);
            pEVar4 = AST::EndpointDeclaration::getDetails(pEVar10);
            pEVar4 = AST::Allocator::
                     allocate<soul::AST::EndpointDetails,soul::AST::EndpointDetails&>
                               (allocator,pEVar4);
            pool_ptr<soul::AST::EndpointDetails>::pool_ptr<soul::AST::EndpointDetails,void>
                      (&local_140,pEVar4);
            pEVar10 = pool_ptr<soul::AST::EndpointDeclaration>::operator->
                                ((pool_ptr<soul::AST::EndpointDeclaration> *)&__range7);
            (pEVar10->details).object = local_140.object;
            pool_ptr<soul::AST::EndpointDetails>::~pool_ptr(&local_140);
            pEVar10 = pool_ptr<soul::AST::EndpointDeclaration>::operator->
                                ((pool_ptr<soul::AST::EndpointDeclaration> *)&__range7);
            pEVar10->needsToBeExposedInParent = true;
            pEVar10 = pool_ptr<soul::AST::EndpointDeclaration>::operator*
                                ((pool_ptr<soul::AST::EndpointDeclaration> *)&__range7);
            pool_ref<soul::AST::EndpointDeclaration>::pool_ref<soul::AST::EndpointDeclaration,void>
                      ((pool_ref<soul::AST::EndpointDeclaration> *)&parent,pEVar10);
            std::
            vector<soul::pool_ref<soul::AST::EndpointDeclaration>,_std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>_>_>
            ::push_back(&(graph->super_ProcessorBase).endpoints,
                        (pool_ref<soul::AST::EndpointDeclaration> *)&parent);
            pool_ref<soul::AST::EndpointDeclaration>::~pool_ref
                      ((pool_ref<soul::AST::EndpointDeclaration> *)&parent);
          }
          child = (SharedEndpoint *)0x0;
          UStack_160.data = (char *)0x0;
          CodeLocation::CodeLocation((CodeLocation *)&child);
          local_158 = (Scope *)0x0;
          pEVar10 = pool_ptr<soul::AST::EndpointDeclaration>::operator*
                              ((pool_ptr<soul::AST::EndpointDeclaration> *)&__range7);
          pEVar7 = createEndpointRef(allocator,(Context *)&child,pEVar10);
          pSVar5 = AST::Allocator::
                   allocate<soul::AST::Connection::SharedEndpoint,soul::AST::Expression&>
                             (allocator,pEVar7);
          AST::Context::~Context((Context *)&child);
          local_188.location.sourceCode.object = (SourceCodeText *)0x0;
          local_188.location.location.data = (char *)0x0;
          local_150 = pSVar5;
          CodeLocation::CodeLocation(&local_188.location);
          local_188.parentScope = (Scope *)0x0;
          pool_ref::operator_cast_to_pool_ptr((pool_ref *)&local_190);
          pEVar10 = pool_ref::operator_cast_to_EndpointDeclaration_(parentEndpoint.object);
          pSVar5 = createConnectionEndpoint(allocator,&local_188,&local_190,pEVar10);
          pool_ptr<soul::AST::ProcessorInstance>::~pool_ptr(&local_190);
          AST::Context::~Context(&local_188);
          local_1b8.location.sourceCode.object = (SourceCodeText *)0x0;
          local_1b8.location.location.data = (char *)0x0;
          local_1b8.parentScope = (Scope *)0x0;
          local_170 = pSVar5;
          AST::Context::Context(&local_1b8);
          local_1bc = none;
          __range3 = (vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
                      *)0x0;
          o = AST::Allocator::
              allocate<soul::AST::Connection,soul::AST::Context,soul::InterpolationType,soul::AST::Connection::SharedEndpoint&,soul::AST::Connection::SharedEndpoint&,decltype(nullptr)>
                        (allocator,&local_1b8,&local_1bc,local_170,local_150,&__range3);
          pool_ref<soul::AST::Connection>::pool_ref<soul::AST::Connection,void>(&local_198,o);
          std::
          vector<soul::pool_ref<soul::AST::Connection>,_std::allocator<soul::pool_ref<soul::AST::Connection>_>_>
          ::push_back(&graph->connections,&local_198);
          pool_ref<soul::AST::Connection>::~pool_ref(&local_198);
          AST::Context::~Context(&local_1b8);
          bVar2 = true;
          pool_ptr<soul::AST::EndpointDeclaration>::~pool_ptr
                    ((pool_ptr<soul::AST::EndpointDeclaration> *)&__range7);
        }
      }
    }
    pool_ptr<soul::AST::ProcessorBase>::~pool_ptr((pool_ptr<soul::AST::ProcessorBase> *)&__range4);
    __gnu_cxx::
    __normal_iterator<soul::pool_ref<soul::AST::ProcessorInstance>_*,_std::vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>_>
    ::operator++(&__end2_1);
  }
  if (bVar2 != false) {
    __end3 = std::
             vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
             ::begin(&graph->processorInstances);
    i_1 = (pool_ref<soul::AST::ProcessorInstance> *)
          std::
          vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
          ::end(&graph->processorInstances);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<soul::pool_ref<soul::AST::ProcessorInstance>_*,_std::vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>_>
                                       *)&i_1), bVar1) {
      childProcessor_2.object =
           (ProcessorBase *)
           __gnu_cxx::
           __normal_iterator<soul::pool_ref<soul::AST::ProcessorInstance>_*,_std::vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>_>
           ::operator*(&__end3);
      pPVar6 = pool_ref<soul::AST::ProcessorInstance>::operator->
                         ((pool_ref<soul::AST::ProcessorInstance> *)childProcessor_2.object);
      pEVar7 = pool_ptr<soul::AST::Expression>::operator->(&pPVar6->targetProcessor);
      (*(pEVar7->super_Statement).super_ASTObject._vptr_ASTObject[6])(&__range5);
      bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&__range5);
      if (bVar1) {
        pPVar8 = pool_ptr<soul::AST::ProcessorBase>::operator->
                           ((pool_ptr<soul::AST::ProcessorBase> *)&__range5);
        iVar3 = (*(pPVar8->super_ModuleBase).super_ASTObject._vptr_ASTObject[8])();
        __begin5 = (pool_ref<soul::AST::EndpointDeclaration> *)CONCAT44(extraout_var_00,iVar3);
        local_1f8 = (ArrayView<soul::pool_ref<soul::AST::EndpointDeclaration>_> *)&__begin5;
        __end5 = ArrayView<soul::pool_ref<soul::AST::EndpointDeclaration>_>::begin(local_1f8);
        ppVar9 = ArrayView<soul::pool_ref<soul::AST::EndpointDeclaration>_>::end(local_1f8);
        for (; __end5 != ppVar9; __end5 = __end5 + 1) {
          pEVar10 = pool_ref<soul::AST::EndpointDeclaration>::operator->(__end5);
          pEVar10->needsToBeExposedInParent = false;
        }
      }
      pool_ptr<soul::AST::ProcessorBase>::~pool_ptr((pool_ptr<soul::AST::ProcessorBase> *)&__range5)
      ;
      __gnu_cxx::
      __normal_iterator<soul::pool_ref<soul::AST::ProcessorInstance>_*,_std::vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>_>
      ::operator++(&__end3);
    }
  }
  return bVar2;
}

Assistant:

static bool exposeChildEndpoints (AST::Allocator& allocator, AST::Graph& graph)
    {
        bool anyChanges = false;

        for (auto& i : graph.processorInstances)
            if (auto childProcessor = i->targetProcessor->getAsProcessor())
                if (auto childGraph = cast<AST::Graph> (childProcessor))
                    if (exposeChildEndpoints (allocator, *childGraph))
                        anyChanges = true;

        for (auto& processorInstance : graph.processorInstances)
        {
            if (auto childProcessor = processorInstance->targetProcessor->getAsProcessor())
            {
                for (auto& childEndpoint : childProcessor->getEndpoints())
                {
                    if (childEndpoint->needsToBeExposedInParent)
                    {
                        auto parentEndpoint = graph.findEndpoint (childEndpoint->name, false);

                        if (parentEndpoint != nullptr)
                        {
                            for (auto& t : childEndpoint->getDetails().getResolvedDataTypes())
                                ensureEventEndpointSupportsType (allocator, *parentEndpoint, t);
                        }
                        else
                        {
                            parentEndpoint = allocator.allocate<AST::EndpointDeclaration> (AST::Context(), false);
                            parentEndpoint->name = allocator.get (childEndpoint->name);
                            parentEndpoint->details = allocator.allocate<AST::EndpointDetails> (childEndpoint->getDetails());
                            parentEndpoint->needsToBeExposedInParent = true;
                            graph.endpoints.push_back (*parentEndpoint);
                        }

                        auto& parent = allocator.allocate<AST::Connection::SharedEndpoint> (createEndpointRef (allocator, {}, *parentEndpoint));
                        auto& child = createConnectionEndpoint (allocator, {}, processorInstance, childEndpoint);

                        graph.connections.push_back (allocator.allocate<AST::Connection> (AST::Context(), InterpolationType::none,
                                                                                          child, parent, nullptr));
                        anyChanges = true;
                    }
                }
            }
        }

        if (anyChanges)
            for (auto& i : graph.processorInstances)
                if (auto childProcessor = i->targetProcessor->getAsProcessor())
                    for (auto& childEndpoint : childProcessor->getEndpoints())
                        childEndpoint->needsToBeExposedInParent = false;

        return anyChanges;
    }